

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editorrenderer.cpp
# Opt level: O0

void __thiscall EditorRenderer::~EditorRenderer(EditorRenderer *this)

{
  Renderer *this_00;
  ulong uVar1;
  size_type sVar2;
  reference ppEVar3;
  reference ppLVar4;
  int local_4c;
  undefined1 local_48 [4];
  int i_1;
  vector<Light_*,_std::allocator<Light_*>_> lights;
  undefined1 local_28 [4];
  int i;
  vector<Entity_*,_std::allocator<Entity_*>_> entities;
  EditorRenderer *this_local;
  
  (this->super_Fl_Gl_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__EditorRenderer_002e3b70;
  entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  Scene::getEntities((vector<Entity_*,_std::allocator<Entity_*>_> *)local_28,this->editorScene);
  lights.super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  while( true ) {
    uVar1 = (ulong)lights.super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar2 = std::vector<Entity_*,_std::allocator<Entity_*>_>::size
                      ((vector<Entity_*,_std::allocator<Entity_*>_> *)local_28);
    if (sVar2 <= uVar1) break;
    ppEVar3 = std::vector<Entity_*,_std::allocator<Entity_*>_>::operator[]
                        ((vector<Entity_*,_std::allocator<Entity_*>_> *)local_28,
                         (long)lights.super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_);
    if (*ppEVar3 != (value_type)0x0) {
      (*(*ppEVar3)->_vptr_Entity[1])();
    }
    lights.super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         lights.super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  Scene::getLights((vector<Light_*,_std::allocator<Light_*>_> *)local_48,this->editorScene);
  local_4c = 0;
  while( true ) {
    sVar2 = std::vector<Light_*,_std::allocator<Light_*>_>::size
                      ((vector<Light_*,_std::allocator<Light_*>_> *)local_48);
    if (sVar2 <= (ulong)(long)local_4c) break;
    ppLVar4 = std::vector<Light_*,_std::allocator<Light_*>_>::operator[]
                        ((vector<Light_*,_std::allocator<Light_*>_> *)local_48,(long)local_4c);
    if (*ppLVar4 != (value_type)0x0) {
      (*((*ppLVar4)->super_Entity)._vptr_Entity[1])();
    }
    local_4c = local_4c + 1;
  }
  if (this->editorScene != (Scene *)0x0) {
    (*this->editorScene->_vptr_Scene[1])();
  }
  this_00 = this->engineRenderer;
  if (this_00 != (Renderer *)0x0) {
    Renderer::~Renderer(this_00);
    operator_delete(this_00);
  }
  if (this->unlitMaterial != (Material *)0x0) {
    (*this->unlitMaterial->_vptr_Material[1])();
  }
  if (this->unlitShader != (Shader *)0x0) {
    (*this->unlitShader->_vptr_Shader[1])();
  }
  ManyMouse_Quit();
  std::vector<Light_*,_std::allocator<Light_*>_>::~vector
            ((vector<Light_*,_std::allocator<Light_*>_> *)local_48);
  std::vector<Entity_*,_std::allocator<Entity_*>_>::~vector
            ((vector<Entity_*,_std::allocator<Entity_*>_> *)local_28);
  Fl_Gl_Window::~Fl_Gl_Window(&this->super_Fl_Gl_Window);
  return;
}

Assistant:

EditorRenderer::~EditorRenderer()
{
	std::vector<Entity*> entities = editorScene->getEntities();

	for (int i = 0; i < entities.size(); i++)
	{
		delete entities[i];
	}

	std::vector<Light*> lights = editorScene->getLights();

	for (int i = 0; i < lights.size(); i++)
	{
		delete lights[i];
	}

	delete editorScene;
	delete engineRenderer;
	delete unlitMaterial;
	delete unlitShader;
	ManyMouse_Quit();
}